

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O2

void __thiscall qpdf::Tokenizer::expectInlineImage(Tokenizer *this,InputSource *input)

{
  logic_error *this_00;
  
  if (this->state != st_before_token) {
    if (this->state != st_token_ready) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,
                 "QPDFTokenizer::expectInlineImage called when tokenizer is in improper state");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    reset(this);
  }
  findEI(this,input);
  this->before_token = false;
  this->in_token = true;
  this->state = st_inline_image;
  return;
}

Assistant:

void
Tokenizer::expectInlineImage(InputSource& input)
{
    if (state == st_token_ready) {
        reset();
    } else if (state != st_before_token) {
        throw std::logic_error(
            "QPDFTokenizer::expectInlineImage called when tokenizer is in improper state");
    }
    findEI(input);
    before_token = false;
    in_token = true;
    state = st_inline_image;
}